

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  pointer pTVar1;
  pointer pTVar2;
  TestRunOrder TVar3;
  TestRunOrder TVar4;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_48;
  
  if ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    enforceNoDuplicateTestCases(&this->m_handles);
  }
  TVar4 = this->m_currentSortOrder;
  TVar3 = (*config->_vptr_IConfig[0x10])(config);
  if ((TVar4 != TVar3) ||
     ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    sortTests(&local_48,config,&this->m_handles);
    pTVar1 = (this->m_sortedFunctions).
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->m_sortedFunctions).
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_sortedFunctions).
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->m_sortedFunctions).
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->m_sortedFunctions).
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pTVar1 != (pointer)0x0) {
      operator_delete(pTVar1,(long)pTVar2 - (long)pTVar1);
      if (local_48.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    TVar4 = (*config->_vptr_IConfig[0x10])(config);
    this->m_currentSortOrder = TVar4;
  }
  return &this->m_sortedFunctions;
}

Assistant:

std::vector<TestCaseHandle> const &TestRegistry::getAllTestsSorted(IConfig const &config) const {
        if (m_sortedFunctions.empty())
            enforceNoDuplicateTestCases(m_handles);

        if (m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty()) {
            m_sortedFunctions = sortTests(config, m_handles);
            m_currentSortOrder = config.runOrder();
        }
        return m_sortedFunctions;
    }